

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

String * __thiscall
cxxopts::Options::help_one_group(String *__return_storage_ptr__,Options *this,string *g)

{
  bool bVar1;
  ulong uVar2;
  pointer ppVar3;
  vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_> *pvVar4;
  unsigned_long *puVar5;
  pointer ppVar6;
  size_t sVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  HelpOptionDetails *o_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_01;
  size_t in_R8;
  allocator local_259;
  string local_258 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  allocator local_211;
  string local_210 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [8];
  String d;
  HelpOptionDetails *o_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_> *__range1_1;
  iterator fiter;
  size_t allowed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  size_t local_118;
  undefined1 local_110 [8];
  String s;
  HelpOptionDetails *o;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_> *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_69;
  unsigned_long local_68;
  size_t longest;
  OptionHelp format;
  allocator local_31;
  _Self local_30;
  _Self local_28;
  const_iterator group;
  string *g_local;
  Options *this_local;
  String *result;
  
  group._M_node = (_Base_ptr)g;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
       ::find(&this->m_help,g);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
       ::end(&this->m_help);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else {
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&longest);
    local_68 = 0;
    local_69 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                     " ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         group._M_node);
      std::operator+(&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                     " options:\n\n");
      toLocalString<std::__cxx11::string>(&local_90,(cxxopts *)&local_b0,t);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&__range1);
    }
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>
             ::operator->(&local_28);
    pvVar4 = &(ppVar3->second).options;
    __end1 = std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>::
             begin(pvVar4);
    o = (HelpOptionDetails *)
        std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>::end
                  (pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
                                       *)&o), bVar1) {
      s.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
           ::operator*(&__end1);
      (anonymous_namespace)::format_option_abi_cxx11_
                ((String *)local_110,(_anonymous_namespace_ *)s.field_2._8_8_,o_00);
      local_118 = stringLength((String *)local_110);
      puVar5 = std::max<unsigned_long>(&local_68,&local_118);
      local_68 = *puVar5;
      std::__cxx11::string::string((string *)&local_178);
      std::make_pair<std::__cxx11::string&,std::__cxx11::string>
                (&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                 &local_178);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&longest,&local_158);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)local_110);
      __gnu_cxx::
      __normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
      ::operator++(&__end1);
    }
    allowed = 0x1e;
    puVar5 = std::min<unsigned_long>(&local_68,&allowed);
    local_68 = *puVar5;
    fiter._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(0x4a - local_68);
    __range1_1 = (vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_> *)
                 std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&longest);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>
             ::operator->(&local_28);
    pvVar4 = &(ppVar3->second).options;
    __end1_1 = std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>
               ::begin(pvVar4);
    o_1 = (HelpOptionDetails *)
          std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>::end
                    (pvVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
                               *)&o_1), bVar1) {
      d.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
           ::operator*(&__end1_1);
      (anonymous_namespace)::format_description_abi_cxx11_
                ((String *)local_1d0,(_anonymous_namespace_ *)d.field_2._8_8_,
                 (HelpOptionDetails *)(local_68 + 2),(size_t)fiter._M_current,in_R8);
      ppVar6 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&__range1_1);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)ppVar6);
      ppVar6 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&__range1_1);
      sVar7 = stringLength(&ppVar6->first);
      if (local_68 < sVar7) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
        uVar2 = local_68 + 2;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_210,uVar2,' ',&local_211);
        toLocalString<std::__cxx11::string>(&local_1f0,(cxxopts *)local_210,t_00);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string(local_210);
        std::allocator<char>::~allocator((allocator<char> *)&local_211);
      }
      else {
        lVar8 = local_68 + 2;
        ppVar6 = __gnu_cxx::
                 __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator->((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&__range1_1);
        sVar7 = stringLength(&ppVar6->first);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_258,lVar8 - sVar7,' ',&local_259);
        toLocalString<std::__cxx11::string>(&local_238,(cxxopts *)local_258,t_01);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string(local_258);
        std::allocator<char>::~allocator((allocator<char> *)&local_259);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_1d0);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&__range1_1);
      std::__cxx11::string::~string((string *)local_1d0);
      __gnu_cxx::
      __normal_iterator<const_cxxopts::HelpOptionDetails_*,_std::vector<cxxopts::HelpOptionDetails,_std::allocator<cxxopts::HelpOptionDetails>_>_>
      ::operator++(&__end1_1);
    }
    local_69 = 1;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&longest);
  }
  return __return_storage_ptr__;
}

Assistant:

String
Options::help_one_group(const std::string& g) const
{
  typedef std::vector<std::pair<String, String>> OptionHelp;

  auto group = m_help.find(g);
  if (group == m_help.end())
  {
    return "";
  }

  OptionHelp format;

  size_t longest = 0;

  String result;

  if (!g.empty())
  {
    result += toLocalString(" " + g + " options:\n\n");
  }

  for (const auto& o : group->second.options)
  {
    auto s = format_option(o);
    longest = std::max(longest, stringLength(s));
    format.push_back(std::make_pair(s, String()));
  }

  longest = std::min(longest, static_cast<size_t>(OPTION_LONGEST));

  //widest allowed description
  auto allowed = size_t{76} - longest - OPTION_DESC_GAP;

  auto fiter = format.begin();
  for (const auto& o : group->second.options)
  {
    auto d = format_description(o, longest + OPTION_DESC_GAP, allowed);

    result += fiter->first;
    if (stringLength(fiter->first) > longest)
    {
      result += "\n";
      result += toLocalString(std::string(longest + OPTION_DESC_GAP, ' '));
    }
    else
    {
      result += toLocalString(std::string(longest + OPTION_DESC_GAP -
        stringLength(fiter->first),
        ' '));
    }
    result += d;
    result += "\n";

    ++fiter;
  }

  return result;
}